

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void unistrTextCopy(UText *ut,int64_t start,int64_t limit,int64_t destIndex,UBool move,
                   UErrorCode *pErrorCode)

{
  short sVar1;
  ushort uVar2;
  UnicodeString *this;
  ushort uVar3;
  int32_t iVar4;
  long lVar5;
  int length;
  char16_t *pcVar6;
  int start_00;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  this = (UnicodeString *)ut->context;
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  uVar12 = (ulong)iVar4;
  uVar7 = start;
  if ((long)uVar12 < start) {
    uVar7 = uVar12;
  }
  uVar7 = uVar7 & 0xffffffff;
  if (start < 0) {
    uVar7 = 0;
  }
  start_00 = (int)uVar7;
  uVar10 = limit;
  if ((long)uVar12 < limit) {
    uVar10 = uVar12;
  }
  uVar10 = uVar10 & 0xffffffff;
  if (limit < 0) {
    uVar10 = 0;
  }
  iVar8 = (int)uVar10;
  if (destIndex <= (long)uVar12) {
    uVar12 = destIndex;
  }
  uVar11 = (uint)uVar12;
  if (destIndex < 0) {
    uVar11 = 0;
  }
  length = iVar8 - start_00;
  if ((iVar8 < start_00) || ((start_00 < (int)uVar11 && ((int)uVar11 < iVar8)))) {
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    if (move == '\0') {
      (*(this->super_Replaceable).super_UObject._vptr_UObject[5])(this,uVar7,uVar10,(ulong)uVar11);
    }
    else {
      (*(this->super_Replaceable).super_UObject._vptr_UObject[5])(this,uVar7,uVar10);
      if ((int)uVar11 < start_00) {
        start_00 = iVar8;
      }
      if ((length == 0x7fffffff) && (start_00 < 1)) {
        uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
        uVar3 = 2;
        if ((uVar2 & 1) == 0) {
          uVar3 = uVar2 & 0x1e;
        }
        (this->fUnion).fStackFields.fLengthAndFlags = uVar3;
      }
      else {
        icu_63::UnicodeString::doReplace(this,start_00,length,(UChar *)0x0,0,0);
      }
    }
    uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar2 & 0x11) == 0) {
      if ((uVar2 & 2) == 0) {
        pcVar6 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar6 = (char16_t *)((long)&this->fUnion + 2);
      }
    }
    else {
      pcVar6 = (char16_t *)0x0;
    }
    ut->chunkContents = pcVar6;
    if (move == '\0') {
      lVar5 = (long)(iVar8 - start_00) + (long)ut->chunkLength;
      iVar4 = (int32_t)lVar5;
      ut->chunkLength = iVar4;
      ut->chunkNativeLimit = lVar5;
      ut->nativeIndexingLimit = iVar4;
    }
    uVar9 = (iVar8 + uVar11) - start_00;
    if ((int)uVar11 <= start_00) {
      uVar11 = uVar9;
    }
    if (move == '\0') {
      uVar11 = uVar9;
    }
    ut->chunkOffset = uVar11;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }